

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::AddSpaceAllocated(SerialArena *this,size_t space_allocated)

{
  __int_type_conflict2 _Var1;
  size_t space_allocated_local;
  SerialArena *this_local;
  memory_order __b;
  memory_order __b_1;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->space_allocated_).super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = _Var1 + space_allocated;
  return;
}

Assistant:

void AddSpaceAllocated(size_t space_allocated) {
    space_allocated_.store(
        space_allocated_.load(std::memory_order_relaxed) + space_allocated,
        std::memory_order_relaxed);
  }